

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

bool __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::enqueue_timer(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                *this,time_type *time,per_timer_data *timer,wait_op *op)

{
  bool bVar1;
  unsigned_long uVar2;
  size_type sVar3;
  per_timer_data *ppVar4;
  bool local_41;
  undefined1 local_38 [8];
  heap_entry entry;
  wait_op *op_local;
  per_timer_data *timer_local;
  time_type *time_local;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *this_local;
  
  entry.timer_ = (per_timer_data *)op;
  if ((timer->prev_ == (per_timer_data *)0x0) && (timer != this->timers_)) {
    bVar1 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            ::
            is_positive_infinity<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                      (time);
    if (bVar1) {
      uVar2 = std::numeric_limits<unsigned_long>::max();
      timer->heap_index_ = uVar2;
    }
    else {
      sVar3 = std::
              vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
              ::size(&this->heap_);
      timer->heap_index_ = sVar3;
      local_38 = (undefined1  [8])(time->__d).__r;
      entry.time_.__d.__r = (duration)(duration)timer;
      std::
      vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
      ::push_back(&this->heap_,(value_type *)local_38);
      sVar3 = std::
              vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
              ::size(&this->heap_);
      up_heap(this,sVar3 - 1);
    }
    timer->next_ = this->timers_;
    timer->prev_ = (per_timer_data *)0x0;
    if (this->timers_ != (per_timer_data *)0x0) {
      this->timers_->prev_ = timer;
    }
    this->timers_ = timer;
  }
  op_queue<asio::detail::wait_op>::push(&timer->op_queue_,(wait_op *)entry.timer_);
  local_41 = false;
  if (timer->heap_index_ == 0) {
    ppVar4 = (per_timer_data *)op_queue<asio::detail::wait_op>::front(&timer->op_queue_);
    local_41 = ppVar4 == entry.timer_;
  }
  return local_41;
}

Assistant:

bool enqueue_timer(const time_type& time, per_timer_data& timer, wait_op* op)
  {
    // Enqueue the timer object.
    if (timer.prev_ == 0 && &timer != timers_)
    {
      if (this->is_positive_infinity(time))
      {
        // No heap entry is required for timers that never expire.
        timer.heap_index_ = (std::numeric_limits<std::size_t>::max)();
      }
      else
      {
        // Put the new timer at the correct position in the heap. This is done
        // first since push_back() can throw due to allocation failure.
        timer.heap_index_ = heap_.size();
        heap_entry entry = { time, &timer };
        heap_.push_back(entry);
        up_heap(heap_.size() - 1);
      }

      // Insert the new timer into the linked list of active timers.
      timer.next_ = timers_;
      timer.prev_ = 0;
      if (timers_)
        timers_->prev_ = &timer;
      timers_ = &timer;
    }

    // Enqueue the individual timer operation.
    timer.op_queue_.push(op);

    // Interrupt reactor only if newly added timer is first to expire.
    return timer.heap_index_ == 0 && timer.op_queue_.front() == op;
  }